

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFFileInput.cpp
# Opt level: O0

EStatusCode __thiscall CFFFileInput::ReadPrivateDicts(CFFFileInput *this,unsigned_short inFontIndex)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  ulong *puVar4;
  PrivateDictInfo *pPVar5;
  ulong uVar6;
  PrivateDictInfo *local_60;
  EStatusCode status;
  unsigned_short inFontIndex_local;
  CFFFileInput *this_local;
  
  uVar2 = CONCAT62(0,this->mFontsCount);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(0x48),0);
  uVar6 = uVar3 + 8;
  if (SUB168(auVar1 * ZEXT816(0x48),8) != 0 || 0xfffffffffffffff7 < uVar3) {
    uVar6 = 0xffffffffffffffff;
  }
  puVar4 = (ulong *)operator_new__(uVar6);
  *puVar4 = uVar2;
  pPVar5 = (PrivateDictInfo *)(puVar4 + 1);
  if (uVar2 != 0) {
    local_60 = pPVar5;
    do {
      PrivateDictInfo::PrivateDictInfo(local_60);
      local_60 = local_60 + 1;
    } while (local_60 != pPVar5 + uVar2);
  }
  this->mPrivateDicts = pPVar5;
  this_local._4_4_ =
       ReadPrivateDict(this,&this->mTopDictIndex[inFontIndex].mTopDict,
                       this->mPrivateDicts + (int)(uint)inFontIndex);
  if (this_local._4_4_ == eSuccess) {
    this_local._4_4_ = CFFPrimitiveReader::GetInternalState(&this->mPrimitivesReader);
  }
  return this_local._4_4_;
}

Assistant:

EStatusCode CFFFileInput::ReadPrivateDicts(unsigned short inFontIndex)
{
	// allocate all (to maintain indexing...whatever), but read just the relevant font dict
	mPrivateDicts = new PrivateDictInfo[mFontsCount];
	EStatusCode status = ReadPrivateDict(mTopDictIndex[inFontIndex].mTopDict,mPrivateDicts + inFontIndex);

	if(status != PDFHummus::eSuccess)
		return status;
	else
		return mPrimitivesReader.GetInternalState();	
}